

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

int getLargestRec(int match,int *ids,int sx,int sz,Pos *p0,Pos *p1)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  iVar2 = sz;
  if (sz < sx) {
    iVar2 = sx;
  }
  __ptr = calloc((long)iVar2,0xc);
  lVar3 = (long)sx;
  uVar11 = 0;
  if (sz < 1) {
    sz = uVar11;
  }
  piVar7 = ids + lVar3 + -1;
  iVar2 = 0;
  lVar4 = lVar3;
  while (0 < lVar4) {
    piVar5 = piVar7;
    for (lVar8 = 0; (ulong)(uint)sz * 0xc != lVar8; lVar8 = lVar8 + 0xc) {
      iVar6 = 0;
      if (*piVar5 == match) {
        iVar6 = *(int *)((long)__ptr + lVar8) + 1;
      }
      *(int *)((long)__ptr + lVar8) = iVar6;
      piVar5 = piVar5 + lVar3;
    }
    iVar6 = 0;
    for (uVar10 = 0; uVar10 != (uint)sz; uVar10 = uVar10 + 1) {
      iVar1 = *(int *)((long)__ptr + uVar10 * 0xc);
      iVar9 = (int)uVar10;
      if (iVar6 < iVar1) {
        *(int *)((long)__ptr + (long)iVar2 * 0xc + 4) = iVar9;
        *(int *)((long)__ptr + (long)iVar2 * 0xc + 8) = iVar6;
        iVar6 = iVar1;
        iVar2 = iVar2 + 1;
      }
      else if (iVar1 != iVar6) {
        lVar8 = (long)iVar2;
        piVar5 = (int *)((long)__ptr + lVar8 * 0xc + -4);
        do {
          iVar2 = piVar5[-1];
          uVar12 = (iVar9 - iVar2) * iVar6;
          if ((int)uVar11 < (int)uVar12) {
            p0->x = (int)(lVar4 + -1);
            p0->z = iVar2;
            p1->x = iVar6 + (int)lVar4 + -2;
            p1->z = iVar9 + -1;
            uVar11 = uVar12;
          }
          iVar6 = *piVar5;
          piVar5 = piVar5 + -3;
          lVar8 = lVar8 + -1;
        } while (iVar1 < iVar6);
        iVar6 = iVar1;
        iVar2 = (int)lVar8 + 1;
        if (iVar1 == 0) {
          iVar2 = (int)lVar8;
        }
      }
    }
    piVar7 = piVar7 + -1;
    lVar4 = lVar4 + -1;
  }
  free(__ptr);
  return uVar11;
}

Assistant:

int getLargestRec(int match, const int *ids, int sx, int sz, Pos *p0, Pos *p1)
{
    typedef struct { int n, j, w; } entry_t;
    entry_t *meta = (entry_t*) calloc(sx > sz ? sx : sz, sizeof(*meta));
    int i, j, w, m, ret;
    ret = m = 0;

    for (i = sx-1; i >= 0; i--)
    {
        for (j = 0; j < sz; j++)
        {
            if (ids[j*sx + i] == match)
                meta[j].n++;
            else
                meta[j].n = 0;
        }
        for (w = j = 0; j < sz; j++)
        {
            int n = meta[j].n;
            if (n > w)
            {
                meta[m].j = j;
                meta[m].w = w;
                m++;
                w = n;
            }
            if (n == w)
                continue;
            do
            {
                entry_t e = meta[--m];
                int area = w * (j - e.j);
                if (area > ret)
                {
                    p0->x = i; p0->z = e.j;
                    p1->x = i+w-1; p1->z = j-1;
                    ret = area;
                }
                w = e.w;
            }
            while (n < w);
            if ((w = n))
                m++;
        }
    }
    free(meta);
    return ret;
}